

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

int * GetHashTable(BrotliEncoderState *s,int quality,size_t input_size,size_t *table_size)

{
  int iVar1;
  int *local_58;
  int *local_50;
  int *table;
  size_t htsize;
  size_t max_table_size;
  MemoryManager *m;
  size_t *table_size_local;
  size_t input_size_local;
  int quality_local;
  BrotliEncoderState *s_local;
  
  iVar1 = 0x20000;
  if (quality == 0) {
    iVar1 = 0x8000;
  }
  table = (int *)HashTableSize((long)iVar1,input_size);
  if ((quality == 0) && (((ulong)table & 0xaaaaa) == 0)) {
    table = (int *)((long)table << 1);
  }
  if (table < (int *)0x401) {
    local_50 = s->small_table_;
  }
  else {
    if ((int *)s->large_table_size_ < table) {
      s->large_table_size_ = (size_t)table;
      BrotliFree(&s->memory_manager_,s->large_table_);
      s->large_table_ = (int *)0x0;
      if (table == (int *)0x0) {
        local_58 = (int *)0x0;
      }
      else {
        local_58 = (int *)BrotliAllocate(&s->memory_manager_,(long)table << 2);
      }
      s->large_table_ = local_58;
    }
    local_50 = s->large_table_;
  }
  *table_size = (size_t)table;
  memset(local_50,0,(long)table << 2);
  return local_50;
}

Assistant:

static int* GetHashTable(BrotliEncoderState* s, int quality,
                         size_t input_size, size_t* table_size) {
  /* Use smaller hash table when input.size() is smaller, since we
     fill the table, incurring O(hash table size) overhead for
     compression, and if the input is short, we won't need that
     many hash table entries anyway. */
  MemoryManager* m = &s->memory_manager_;
  const size_t max_table_size = MaxHashTableSize(quality);
  size_t htsize = HashTableSize(max_table_size, input_size);
  int* table;
  BROTLI_DCHECK(max_table_size >= 256);
  if (quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
    /* Only odd shifts are supported by fast-one-pass. */
    if ((htsize & 0xAAAAA) == 0) {
      htsize <<= 1;
    }
  }

  if (htsize <= sizeof(s->small_table_) / sizeof(s->small_table_[0])) {
    table = s->small_table_;
  } else {
    if (htsize > s->large_table_size_) {
      s->large_table_size_ = htsize;
      BROTLI_FREE(m, s->large_table_);
      s->large_table_ = BROTLI_ALLOC(m, int, htsize);
      if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(s->large_table_)) return 0;
    }
    table = s->large_table_;
  }

  *table_size = htsize;
  memset(table, 0, htsize * sizeof(*table));
  return table;
}